

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O1

void Ssw_ManCollectPos_rec(Ssw_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vNewPos)

{
  ulong uVar1;
  Vec_Ptr_t *pVVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  Aig_Obj_t *pObj_00;
  uint uVar6;
  uint uVar7;
  int iVar8;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswDyn.c"
                  ,0x6b,"void Ssw_ManCollectPos_rec(Ssw_Man_t *, Aig_Obj_t *, Vec_Int_t *)");
  }
  uVar1 = *(ulong *)&pObj->field_0x18;
  if ((uVar1 & 0x20) != 0) {
    return;
  }
  *(ulong *)&pObj->field_0x18 = uVar1 | 0x20;
  if (p->nSRMiterMaxId < pObj->Id) {
    return;
  }
  if (((uint)uVar1 & 7) != 3) {
    if (p->pFrames->pFanData == (int *)0x0) {
      __assert_fail("p->pFrames->pFanData != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswDyn.c"
                    ,0x7b,"void Ssw_ManCollectPos_rec(Ssw_Man_t *, Aig_Obj_t *, Vec_Int_t *)");
    }
    if ((*(uint *)&pObj->field_0x18 & 0xffffffc0) == 0) {
      return;
    }
    uVar7 = 0xffffffff;
    uVar6 = 0;
    do {
      iVar4 = p->pFrames->nFansAlloc;
      if (uVar6 == 0) {
        if (iVar4 <= pObj->Id) {
          __assert_fail("ObjId < p->nFansAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                        ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
        }
        iVar4 = pObj->Id * 5;
      }
      else {
        if (iVar4 <= (int)uVar7 / 2) {
          __assert_fail("iFan/2 < p->nFansAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                        ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
        }
        iVar4 = ((int)uVar7 >> 1) * 5 + (uVar7 & 1) + 3;
      }
      uVar7 = p->pFrames->pFanData[iVar4];
      pVVar2 = p->pFrames->vObjs;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        pObj_00 = (Aig_Obj_t *)0x0;
      }
      else {
        uVar5 = (int)uVar7 >> 1;
        if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pObj_00 = (Aig_Obj_t *)pVVar2->pArray[uVar5];
      }
      Ssw_ManCollectPos_rec(p,pObj_00,vNewPos);
      uVar6 = uVar6 + 1;
      if (*(uint *)&pObj->field_0x18 >> 6 <= uVar6) {
        return;
      }
    } while( true );
  }
  iVar4 = (pObj->field_0).CioId;
  if (p->pFrames->nObjs[3] - p->pAig->nRegs <= iVar4) {
    return;
  }
  uVar7 = vNewPos->nCap;
  if (vNewPos->nSize == uVar7) {
    if ((int)uVar7 < 0x10) {
      if (vNewPos->pArray == (int *)0x0) {
        piVar3 = (int *)malloc(0x40);
      }
      else {
        piVar3 = (int *)realloc(vNewPos->pArray,0x40);
      }
      vNewPos->pArray = piVar3;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar7 * 2;
      if (iVar8 <= (int)uVar7) goto LAB_006a2d68;
      if (vNewPos->pArray == (int *)0x0) {
        piVar3 = (int *)malloc((ulong)uVar7 << 3);
      }
      else {
        piVar3 = (int *)realloc(vNewPos->pArray,(ulong)uVar7 << 3);
      }
      vNewPos->pArray = piVar3;
    }
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vNewPos->nCap = iVar8;
  }
LAB_006a2d68:
  iVar8 = vNewPos->nSize;
  vNewPos->nSize = iVar8 + 1;
  vNewPos->pArray[iVar8] = iVar4 / 2;
  return;
}

Assistant:

void Ssw_ManCollectPos_rec( Ssw_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vNewPos )
{
    Aig_Obj_t * pFanout;
    int iFanout = -1, i;
    assert( !Aig_IsComplement(pObj) );
    if ( pObj->fMarkB )
        return;
    pObj->fMarkB = 1;
    if ( pObj->Id > p->nSRMiterMaxId )
        return;
    if ( Aig_ObjIsCo(pObj) )
    {
        // skip if it is a register input PO
        if ( Aig_ObjCioId(pObj) >= Aig_ManCoNum(p->pFrames)-Aig_ManRegNum(p->pAig) )
            return;
        // add the number of this constraint
        Vec_IntPush( vNewPos, Aig_ObjCioId(pObj)/2 );
        return;
    }
    // visit the fanouts
    assert( p->pFrames->pFanData != NULL );
    Aig_ObjForEachFanout( p->pFrames, pObj, pFanout, iFanout, i )
        Ssw_ManCollectPos_rec( p, pFanout, vNewPos );
}